

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
TargetRuntimeDllsNode::Evaluate
          (string *__return_storage_ptr__,TargetRuntimeDllsNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *param_4)

{
  string *name;
  pointer ppcVar1;
  TargetType TVar2;
  cmGeneratorTarget *this_00;
  cmComputeLinkInformation *pcVar3;
  ostream *poVar4;
  pointer ppcVar5;
  string_view separator;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dllPaths;
  string local_1c8;
  ostringstream e;
  bool local_188;
  
  name = (parameters->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  this_00 = cmLocalGenerator::FindGeneratorTargetToUse(context->LG,name);
  if (this_00 == (cmGeneratorTarget *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar4 = std::operator<<((ostream *)&e,"Objects of target \"");
    poVar4 = std::operator<<(poVar4,(string *)name);
    std::operator<<(poVar4,"\" referenced but no such target exists.");
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)&dllPaths,content);
    std::__cxx11::stringbuf::str();
    reportError(context,(string *)&dllPaths,&local_1c8);
  }
  else {
    TVar2 = cmGeneratorTarget::GetType(this_00);
    if ((TVar2 < OBJECT_LIBRARY) && (TVar2 != STATIC_LIBRARY)) {
      pcVar3 = cmGeneratorTarget::GetLinkInformation(this_00,&context->Config);
      if (pcVar3 != (cmComputeLinkInformation *)0x0) {
        dllPaths.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        dllPaths.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        dllPaths.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        ppcVar1 = (pcVar3->RuntimeDLLs).
                  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (ppcVar5 = (pcVar3->RuntimeDLLs).
                       super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                       ._M_impl.super__Vector_impl_data._M_start; ppcVar5 != ppcVar1;
            ppcVar5 = ppcVar5 + 1) {
          cmGeneratorTarget::MaybeGetLocation
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&e,*ppcVar5,&context->Config);
          if (local_188 == true) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &dllPaths,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e);
          }
          std::
          _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&e);
        }
        separator._M_str = ";";
        separator._M_len = 1;
        cmJoin(__return_storage_ptr__,&dllPaths,separator,(string_view)ZEXT816(0));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&dllPaths);
        return __return_storage_ptr__;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",(allocator<char> *)&e);
      return __return_storage_ptr__;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar4 = std::operator<<((ostream *)&e,"Objects of target \"");
    poVar4 = std::operator<<(poVar4,(string *)name);
    poVar4 = std::operator<<(poVar4,"\" referenced but is not one of the allowed target types ");
    std::operator<<(poVar4,"(EXECUTABLE, SHARED, MODULE).");
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)&dllPaths,content);
    std::__cxx11::stringbuf::str();
    reportError(context,(string *)&dllPaths,&local_1c8);
  }
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&dllPaths);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* /*dagChecker*/) const override
  {
    std::string const& tgtName = parameters.front();
    cmGeneratorTarget* gt = context->LG->FindGeneratorTargetToUse(tgtName);
    if (!gt) {
      std::ostringstream e;
      e << "Objects of target \"" << tgtName
        << "\" referenced but no such target exists.";
      reportError(context, content->GetOriginalExpression(), e.str());
      return std::string();
    }
    cmStateEnums::TargetType type = gt->GetType();
    if (type != cmStateEnums::EXECUTABLE &&
        type != cmStateEnums::SHARED_LIBRARY &&
        type != cmStateEnums::MODULE_LIBRARY) {
      std::ostringstream e;
      e << "Objects of target \"" << tgtName
        << "\" referenced but is not one of the allowed target types "
        << "(EXECUTABLE, SHARED, MODULE).";
      reportError(context, content->GetOriginalExpression(), e.str());
      return std::string();
    }

    if (auto* cli = gt->GetLinkInformation(context->Config)) {
      std::vector<std::string> dllPaths;
      auto const& dlls = cli->GetRuntimeDLLs();

      for (auto const& dll : dlls) {
        if (auto loc = dll->MaybeGetLocation(context->Config)) {
          dllPaths.emplace_back(*loc);
        }
      }

      return cmJoin(dllPaths, ";");
    }

    return "";
  }